

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::GpuCounterConfig::ParseFromArray
          (GpuCounterConfig *this,void *raw,size_t size)

{
  byte bVar1;
  pointer puVar2;
  iterator __position;
  bool bVar3;
  short sVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong *puVar9;
  uint *puVar10;
  uint8_t cur_byte_3;
  ulong uVar11;
  uint8_t cur_byte_2;
  ulong *puVar12;
  uint8_t cur_byte;
  ulong uVar13;
  uint8_t cur_byte_1;
  ulong *puVar14;
  Field local_58;
  ulong *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  puVar2 = (this->counter_ids_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->counter_ids_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->counter_ids_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  (this->unknown_fields_)._M_string_length = 0;
  local_40 = &this->counter_ids_;
  local_38 = &this->unknown_fields_;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar9 = (ulong *)(size + (long)raw);
  do {
    if (puVar9 <= raw) goto switchD_00230825_caseD_3;
    bVar1 = (byte)*raw;
    uVar8 = (ulong)bVar1;
    puVar12 = (ulong *)((long)raw + 1);
    if ((char)bVar1 < '\0') {
      uVar8 = (ulong)(bVar1 & 0x7f);
      lVar6 = 7;
      do {
        if ((puVar9 <= puVar12) || (0x38 < lVar6 - 7U)) goto switchD_00230825_caseD_3;
        uVar5 = *puVar12;
        puVar12 = (ulong *)((long)puVar12 + 1);
        uVar8 = uVar8 | (ulong)((byte)uVar5 & 0x7f) << ((byte)lVar6 & 0x3f);
        lVar6 = lVar6 + 7;
      } while ((char)(byte)uVar5 < '\0');
    }
    uVar5 = uVar8 >> 3;
    if (((uint)uVar5 == 0) || (puVar9 <= puVar12)) goto switchD_00230825_caseD_3;
    switch((uint)uVar8 & 7) {
    case 0:
      uVar7 = 0;
      uVar11 = 0;
      while( true ) {
        puVar14 = (ulong *)((long)puVar12 + 1);
        uVar7 = (ulong)((byte)*puVar12 & 0x7f) << ((byte)uVar11 & 0x3f) | uVar7;
        if (-1 < (char)(byte)*puVar12) break;
        if ((puVar9 <= puVar14) ||
           (bVar3 = 0x38 < uVar11, uVar11 = uVar11 + 7, puVar12 = puVar14, bVar3))
        goto switchD_00230825_caseD_3;
      }
      uVar11 = uVar7 & 0xffffffff00000000;
      break;
    case 1:
      puVar14 = puVar12 + 1;
      if (puVar9 < puVar14) goto switchD_00230825_caseD_3;
      uVar7 = *puVar12;
      uVar11 = uVar7 & 0xffffffff00000000;
      break;
    case 2:
      puVar12 = (ulong *)((long)puVar12 + 1);
      uVar13 = 0;
      uVar7 = 0;
      puVar14 = puVar12;
      while (uVar13 = (ulong)(*(byte *)((long)puVar14 + -1) & 0x7f) << ((byte)uVar7 & 0x3f) | uVar13
            , (char)*(byte *)((long)puVar14 + -1) < '\0') {
        if (puVar9 <= puVar14) goto switchD_00230825_caseD_3;
        puVar14 = (ulong *)((long)puVar14 + 1);
        puVar12 = (ulong *)((long)puVar12 + 1);
        bVar3 = 0x38 < uVar7;
        uVar7 = uVar7 + 7;
        if (bVar3) goto switchD_00230825_caseD_3;
      }
      if (uVar13 <= (ulong)((long)puVar9 - (long)puVar12)) {
        uVar11 = (ulong)puVar12 & 0xffffffff00000000;
        puVar14 = (ulong *)((long)puVar14 + uVar13);
        uVar7 = (ulong)puVar12 & 0xffffffff;
        goto LAB_00230902;
      }
    default:
      goto switchD_00230825_caseD_3;
    case 5:
      puVar14 = (ulong *)((long)puVar12 + 4);
      if (puVar9 < puVar14) goto switchD_00230825_caseD_3;
      uVar7 = (ulong)(uint)*puVar12;
      uVar11 = 0;
    }
    uVar13 = 0;
LAB_00230902:
    raw = puVar14;
  } while ((0xffff < (uint)uVar5) || (0xfffffff < uVar13));
  local_58.int_value_ = uVar11 | uVar7 & 0xffffffff;
  uVar7 = uVar5 << 0x20 | uVar13;
  local_58.type_ = (byte)(uVar7 >> 0x30) | (byte)uVar8 & 7;
  local_58.size_ = (uint32_t)uVar13;
  local_58.id_ = (uint16_t)(uVar7 >> 0x20);
  sVar4 = (short)uVar5;
  while (sVar4 != 0) {
    if ((ushort)uVar5 < 5) {
      (this->_has_field_).super__Base_bitset<1UL>._M_w =
           (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar5 & 0x3f);
    }
    switch((uint)uVar5 & 0xffff) {
    case 1:
      this->counter_period_ns_ = local_58.int_value_;
      break;
    case 2:
      __position._M_current =
           (this->counter_ids_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->counter_ids_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<>
                  (local_40,__position);
        puVar10 = (this->counter_ids_).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      else {
        *__position._M_current = 0;
        puVar10 = __position._M_current + 1;
        (this->counter_ids_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_finish = puVar10;
      }
      puVar10[-1] = (uint)local_58.int_value_;
      break;
    case 3:
      this->instrumented_sampling_ = local_58.int_value_ != 0;
      break;
    case 4:
      this->fix_gpu_clock_ = local_58.int_value_ != 0;
      break;
    default:
      local_48 = (ulong *)raw;
      protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_58,local_38);
      raw = local_48;
    }
    do {
      if (puVar9 <= raw) goto switchD_00230825_caseD_3;
      bVar1 = (byte)*raw;
      uVar8 = (ulong)(uint)bVar1;
      puVar12 = (ulong *)((long)raw + 1);
      if ((char)bVar1 < '\0') {
        uVar8 = (ulong)(bVar1 & 0x7f);
        lVar6 = 7;
        do {
          if ((puVar9 <= puVar12) || (0x38 < lVar6 - 7U)) goto switchD_00230825_caseD_3;
          uVar5 = *puVar12;
          puVar12 = (ulong *)((long)puVar12 + 1);
          uVar8 = uVar8 | (ulong)((byte)uVar5 & 0x7f) << ((byte)lVar6 & 0x3f);
          lVar6 = lVar6 + 7;
        } while ((char)(byte)uVar5 < '\0');
      }
      uVar5 = uVar8 >> 3;
      if (((uint)uVar5 == 0) || (puVar9 <= puVar12)) goto switchD_00230825_caseD_3;
      switch((uint)uVar8 & 7) {
      case 0:
        uVar7 = 0;
        uVar11 = 0;
        while( true ) {
          puVar14 = (ulong *)((long)puVar12 + 1);
          uVar7 = (ulong)((byte)*puVar12 & 0x7f) << ((byte)uVar11 & 0x3f) | uVar7;
          if (-1 < (char)(byte)*puVar12) break;
          if ((puVar9 <= puVar14) ||
             (bVar3 = 0x38 < uVar11, uVar11 = uVar11 + 7, puVar12 = puVar14, bVar3))
          goto switchD_00230825_caseD_3;
        }
        uVar11 = uVar7 & 0xffffffff00000000;
        break;
      case 1:
        puVar14 = puVar12 + 1;
        if (puVar9 < puVar14) goto switchD_00230825_caseD_3;
        uVar7 = *puVar12;
        uVar11 = uVar7 & 0xffffffff00000000;
        break;
      case 2:
        puVar12 = (ulong *)((long)puVar12 + 1);
        uVar13 = 0;
        uVar7 = 0;
        puVar14 = puVar12;
        while (uVar13 = (ulong)(*(byte *)((long)puVar14 + -1) & 0x7f) << ((byte)uVar7 & 0x3f) |
                        uVar13, (char)*(byte *)((long)puVar14 + -1) < '\0') {
          if (puVar9 <= puVar14) goto switchD_00230825_caseD_3;
          puVar14 = (ulong *)((long)puVar14 + 1);
          puVar12 = (ulong *)((long)puVar12 + 1);
          bVar3 = 0x38 < uVar7;
          uVar7 = uVar7 + 7;
          if (bVar3) goto switchD_00230825_caseD_3;
        }
        if (uVar13 <= (ulong)((long)puVar9 - (long)puVar12)) {
          uVar11 = (ulong)puVar12 & 0xffffffff00000000;
          puVar14 = (ulong *)((long)puVar14 + uVar13);
          uVar7 = (ulong)puVar12 & 0xffffffff;
          goto LAB_00230c30;
        }
      default:
        goto switchD_00230825_caseD_3;
      case 5:
        puVar14 = (ulong *)((long)puVar12 + 4);
        if (puVar9 < puVar14) goto switchD_00230825_caseD_3;
        uVar7 = (ulong)(uint)*puVar12;
        uVar11 = 0;
      }
      uVar13 = 0;
LAB_00230c30:
      raw = puVar14;
    } while ((0xffff < (uint)uVar5) || (0xfffffff < uVar13));
    local_58.int_value_ = uVar11 | uVar7 & 0xffffffff;
    uVar7 = uVar5 << 0x20 | uVar13;
    local_58.type_ = (byte)(uVar7 >> 0x30) | (byte)uVar8 & 7;
    local_58.size_ = (uint32_t)uVar13;
    local_58.id_ = (uint16_t)(uVar7 >> 0x20);
    sVar4 = (short)uVar5;
  }
switchD_00230825_caseD_3:
  return puVar9 == (ulong *)raw;
}

Assistant:

bool GpuCounterConfig::ParseFromArray(const void* raw, size_t size) {
  counter_ids_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* counter_period_ns */:
        field.get(&counter_period_ns_);
        break;
      case 2 /* counter_ids */:
        counter_ids_.emplace_back();
        field.get(&counter_ids_.back());
        break;
      case 3 /* instrumented_sampling */:
        field.get(&instrumented_sampling_);
        break;
      case 4 /* fix_gpu_clock */:
        field.get(&fix_gpu_clock_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}